

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

int32_t __thiscall icu_63::LocalizationInfo::indexForLocale(LocalizationInfo *this,UChar *locale)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  uint local_24;
  int i;
  UChar *locale_local;
  LocalizationInfo *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar2 = (*this->_vptr_LocalizationInfo[5])();
    if (iVar2 <= (int)local_24) {
      return -1;
    }
    iVar2 = (*this->_vptr_LocalizationInfo[6])(this,(ulong)local_24);
    UVar1 = streq(locale,(UChar *)CONCAT44(extraout_var,iVar2));
    if (UVar1 != '\0') break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int32_t
LocalizationInfo::indexForLocale(const UChar* locale) const {
    for (int i = 0; i < getNumberOfDisplayLocales(); ++i) {
        if (streq(locale, getLocaleName(i))) {
            return i;
        }
    }
    return -1;
}